

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControl::find(QWidgetTextControl *this,QRegularExpression *exp,FindFlags options)

{
  byte bVar1;
  long in_FS_OFFSET;
  QTextCursor search;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::find(&local_28,*(undefined8 *)(*(long *)(this + 8) + 0x78),exp,
                      *(long *)(this + 8) + 0x88,
                      options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
                      super_QFlagsStorage<QTextDocument::FindFlag>.i);
  bVar1 = QTextCursor::isNull();
  if (bVar1 == 0) {
    setTextCursor(this,(QTextCursor *)&local_28,false);
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)(bVar1 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::find(const QRegularExpression &exp, QTextDocument::FindFlags options)
{
    Q_D(QWidgetTextControl);
    QTextCursor search = d->doc->find(exp, d->cursor, options);
    if (search.isNull())
        return false;

    setTextCursor(search);
    return true;
}